

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_freeFunction p_Var1;
  
  if (params != (ZSTD_CCtx_params *)0x0) {
    p_Var1 = (params->customMem).customFree;
    if (p_Var1 == (ZSTD_freeFunction)0x0) {
      free(params);
    }
    else {
      (*p_Var1)((params->customMem).opaque,params);
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params* params)
{
    if (params == NULL) { return 0; }
    ZSTD_customFree(params, params->customMem);
    return 0;
}